

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int cvLsDenseDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  sunindextype sVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  sunrealtype *psVar8;
  long j;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_a0;
  long local_98;
  double local_88;
  
  pvVar2 = cv_mem->cv_lmem;
  sVar4 = SUNDenseMatrix_Columns(Jac);
  uVar5 = N_VCloneEmpty(tmp1);
  lVar6 = N_VGetArrayPointer(cv_mem->cv_ewt);
  lVar7 = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet == 0) {
    local_98 = 0;
  }
  else {
    local_98 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  dVar9 = cv_mem->cv_uround;
  local_a0 = 0.0;
  if (0.0 < dVar9) {
    if (dVar9 < 0.0) {
      local_a0 = sqrt(dVar9);
    }
    else {
      local_a0 = SQRT(dVar9);
    }
  }
  dVar9 = (double)N_VWrmsNorm(fy,cv_mem->cv_ewt);
  local_88 = 1.0;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_88 = dVar9 * (double)sVar4 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  if (sVar4 < 1) {
    sVar4 = 0;
  }
  for (j = 0; sVar4 != j; j = j + 1) {
    psVar8 = SUNDenseMatrix_Column(Jac,j);
    N_VSetArrayPointer(psVar8,uVar5);
    dVar9 = *(double *)(lVar7 + j * 8);
    dVar10 = local_88 / *(double *)(lVar6 + j * 8);
    dVar12 = ABS(dVar9) * local_a0;
    if (ABS(dVar9) * local_a0 <= dVar10) {
      dVar12 = dVar10;
    }
    if (cv_mem->cv_constraintsSet != 0) {
      dVar10 = *(double *)(local_98 + j * 8);
      dVar11 = ABS(dVar10);
      if ((dVar11 != 1.0) || (NAN(dVar11))) {
        if ((dVar11 == 2.0) && ((!NAN(dVar11) && ((dVar9 + dVar12) * dVar10 <= 0.0))))
        goto LAB_00115cd3;
      }
      else if ((dVar9 + dVar12) * dVar10 < 0.0) {
LAB_00115cd3:
        dVar12 = -dVar12;
      }
    }
    *(double *)(lVar7 + j * 8) = dVar9 + dVar12;
    iVar3 = (*cv_mem->cv_f)(t,y,tmp1,cv_mem->cv_user_data);
    plVar1 = (long *)((long)pvVar2 + 0x90);
    *plVar1 = *plVar1 + 1;
    if (iVar3 != 0) goto LAB_00115d62;
    *(double *)(lVar7 + j * 8) = dVar9;
    N_VLinearSum(1.0 / dVar12,-(1.0 / dVar12),tmp1,fy,uVar5);
  }
  iVar3 = 0;
LAB_00115d62:
  N_VSetArrayPointer(0,uVar5);
  N_VDestroy(uVar5);
  return iVar3;
}

Assistant:

int cvLsDenseDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                   CVodeMem cv_mem, N_Vector tmp1)
{
  sunrealtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  sunrealtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, y */
  ewt_data = N_VGetArrayPointer(cv_mem->cv_ewt);
  y_data   = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(cv_mem->cv_uround);
  fnorm  = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * N * fnorm)
                           : ONE;

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);

    yjsaved = y_data[j];
    inc     = SUNMAX(srur * SUNRabs(yjsaved), minInc / ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (cv_mem->cv_constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yjsaved + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yjsaved + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    y_data[j] += inc;

    retval = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) { break; }

    y_data[j] = yjsaved;

    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}